

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_print_errors(FILE *fp,arg_end *end,char *progname)

{
  arg_dstr_t ds;
  
  ds = arg_dstr_create();
  arg_print_errors_ds(ds,end,progname);
  fputs(ds->data,(FILE *)fp);
  arg_dstr_destroy(ds);
  return;
}

Assistant:

void arg_print_errors(FILE* fp, struct arg_end* end, const char* progname) {
    arg_dstr_t ds = arg_dstr_create();
    arg_print_errors_ds(ds, end, progname);
    fputs(arg_dstr_cstr(ds), fp);
    arg_dstr_destroy(ds);
}